

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<Fad<float>_>::Resize(TPZVec<Fad<float>_> *this,int64_t newsize)

{
  long lVar1;
  Fad<float> *pFVar2;
  undefined1 auVar3 [16];
  ostream *this_00;
  void *this_01;
  long lVar4;
  ulong uVar5;
  ulong *puVar6;
  ulong in_RSI;
  long in_RDI;
  ulong uVar7;
  int64_t i;
  int64_t large;
  Fad<float> *newstore;
  Fad<float> *in_stack_ffffffffffffff18;
  Fad<float> *in_stack_ffffffffffffff20;
  Fad<float> *this_02;
  Fad<float> *in_stack_ffffffffffffff30;
  long lVar8;
  ulong local_a8;
  ulong *local_90;
  long local_38;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    this_01 = (void *)std::ostream::operator<<(this_00,in_RSI);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  if (in_RSI != *(ulong *)(in_RDI + 0x10)) {
    if (in_RSI == 0) {
      *(undefined8 *)(in_RDI + 0x10) = 0;
      *(undefined8 *)(in_RDI + 0x18) = 0;
      lVar8 = *(long *)(in_RDI + 8);
      if (lVar8 != 0) {
        lVar1 = *(long *)(lVar8 + -8);
        for (lVar4 = lVar8 + lVar1 * 0x20; lVar8 != lVar4; lVar4 = lVar4 + -0x20) {
          Fad<float>::~Fad(in_stack_ffffffffffffff20);
        }
        operator_delete__((void *)(lVar8 + -8),lVar1 * 0x20 + 8);
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = in_RSI;
      uVar5 = SUB168(auVar3 * ZEXT816(0x20),0);
      uVar7 = uVar5 + 8;
      if (SUB168(auVar3 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar5) {
        uVar7 = 0xffffffffffffffff;
      }
      puVar6 = (ulong *)operator_new__(uVar7);
      *puVar6 = in_RSI;
      puVar6 = puVar6 + 1;
      if (in_RSI != 0) {
        local_90 = puVar6;
        do {
          Fad<float>::Fad(in_stack_ffffffffffffff30);
          local_90 = local_90 + 4;
        } while (local_90 != puVar6 + in_RSI * 4);
      }
      local_a8 = in_RSI;
      if (*(long *)(in_RDI + 0x10) < (long)in_RSI) {
        local_a8 = *(ulong *)(in_RDI + 0x10);
      }
      for (local_38 = 0; local_38 < (long)local_a8; local_38 = local_38 + 1) {
        Fad<float>::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      if ((*(long *)(in_RDI + 8) != 0) &&
         (pFVar2 = *(Fad<float> **)(in_RDI + 8), pFVar2 != (Fad<float> *)0x0)) {
        lVar8 = *(long *)&pFVar2[-1].defaultVal;
        this_02 = pFVar2 + lVar8;
        while (pFVar2 != this_02) {
          this_02 = this_02 + -1;
          Fad<float>::~Fad(this_02);
        }
        operator_delete__(&pFVar2[-1].defaultVal,lVar8 * 0x20 + 8);
      }
      *(ulong **)(in_RDI + 8) = puVar6;
      *(ulong *)(in_RDI + 0x10) = in_RSI;
      *(ulong *)(in_RDI + 0x18) = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}